

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMesh::ClearNodes(ChMesh *this)

{
  ChSystem *pCVar1;
  
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
  ::clear(&this->velements);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
  ::clear(&this->vnodes);
  std::
  vector<std::shared_ptr<chrono::fea::ChContactSurface>,_std::allocator<std::shared_ptr<chrono::fea::ChContactSurface>_>_>
  ::clear(&this->vcontactsurfaces);
  pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  if (pCVar1 != (ChSystem *)0x0) {
    pCVar1->is_updated = false;
  }
  return;
}

Assistant:

void ChMesh::ClearNodes() {
    velements.clear();
    vnodes.clear();
    vcontactsurfaces.clear();

    // If the mesh is already added to a system, mark the system out-of-date
    if (system) {
        system->is_updated = false;
    }
}